

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

bool DiffDistTest2<unsigned_long,Blob<224>>(pfHash hash,bool drawDiagram)

{
  bool bVar1;
  reference this;
  byte in_SIL;
  code *in_RDI;
  int i;
  int keybit;
  bool result;
  Blob<224> h2;
  Blob<224> h1;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  unsigned_long k;
  int keycount;
  int keybits;
  Rand r;
  uint32_t in_stack_ffffffffffffff2c;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  Blob<224> *in_stack_ffffffffffffff48;
  Rand *in_stack_ffffffffffffff50;
  int local_a0;
  uint local_9c;
  byte local_95;
  Blob<224> local_94;
  Blob<224> local_78;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> local_48;
  undefined1 local_30 [12];
  undefined4 local_24;
  int local_20;
  byte local_9;
  code *local_8;
  
  local_9 = in_SIL & 1;
  local_8 = in_RDI;
  Rand::Rand((Rand *)CONCAT17(in_stack_ffffffffffffff37,
                              CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
             in_stack_ffffffffffffff2c);
  local_20 = 0x40;
  local_24 = 0x200000;
  std::allocator<Blob<224>_>::allocator((allocator<Blob<224>_> *)0x187375);
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::vector
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)in_stack_ffffffffffffff50,
             (size_type)in_stack_ffffffffffffff48,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  std::allocator<Blob<224>_>::~allocator((allocator<Blob<224>_> *)0x18739b);
  Blob<224>::Blob(&local_78);
  Blob<224>::Blob(&local_94);
  local_95 = 1;
  for (local_9c = 0; (int)local_9c < local_20; local_9c = local_9c + 1) {
    printf("Testing bit %d\n",(ulong)local_9c);
    for (local_a0 = 0; local_a0 < 0x200000; local_a0 = local_a0 + 1) {
      Rand::rand_p(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      (*local_8)(local_30,8,0,&local_78);
      flipbit(local_30,8,local_9c);
      (*local_8)(local_30,8,0,&local_94);
      Blob<224>::operator^
                (in_stack_ffffffffffffff48,
                 (Blob<224> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      this = std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::operator[]
                       (&local_48,(long)local_a0);
      Blob<224>::operator=(this,(Blob<224> *)&stack0xffffffffffffff44);
    }
    bVar1 = TestHashList<Blob<224>>
                      ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)h2.bytes._12_8_,
                       (bool)h2.bytes[0xb],(bool)h2.bytes[10],(bool)h2.bytes[9],(bool)h2.bytes[8],
                       (bool)h2.bytes[7]);
    local_95 = bVar1 & local_95;
    printf("\n");
  }
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::~vector
            ((vector<Blob<224>,_std::allocator<Blob<224>_>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  return (bool)(local_95 & 1);
}

Assistant:

bool DiffDistTest2 ( pfHash hash, bool drawDiagram )
{
  Rand r(857374);

  int keybits = sizeof(keytype) * 8;
  const int keycount = 256*256*32;
  keytype k;
  
  std::vector<hashtype> hashes(keycount);
  hashtype h1,h2;

  bool result = true;

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    printf("Testing bit %d\n",keybit);

    for(int i = 0; i < keycount; i++)
    {
      r.rand_p(&k,sizeof(keytype));
      
      hash(&k,sizeof(keytype),0,&h1);
      flipbit(&k,sizeof(keytype),keybit);
      hash(&k,sizeof(keytype),0,&h2);

      hashes[i] = h1 ^ h2;
    }

    result &= TestHashList<hashtype>(hashes,true,true,drawDiagram);
    printf("\n");
  }

  return result;
}